

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O2

void Gudhi::persistence_matrix::swap
               (Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                *col1,Intrusive_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                      *col2)

{
  Field_operators *pFVar1;
  Entry_constructor *pEVar2;
  
  boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::
  swap_tree((node_ptr)col1,(node_ptr)col2);
  pFVar1 = col1->operators_;
  col1->operators_ = col2->operators_;
  col2->operators_ = pFVar1;
  pEVar2 = col1->entryPool_;
  col1->entryPool_ = col2->entryPool_;
  col2->entryPool_ = pEVar2;
  return;
}

Assistant:

void swap(Intrusive_set_column& col1, Intrusive_set_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }